

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O2

ggml_type ggml_type_from_name(string *s)

{
  bool bVar1;
  ggml_type gVar2;
  
  bVar1 = std::operator==(s,"f16");
  if (bVar1) {
    gVar2 = GGML_TYPE_F16;
  }
  else {
    bVar1 = std::operator==(s,"bf16");
    if (bVar1) {
      gVar2 = GGML_TYPE_BF16;
    }
    else {
      bVar1 = std::operator==(s,"q8_0");
      if (bVar1) {
        gVar2 = GGML_TYPE_Q8_0;
      }
      else {
        bVar1 = std::operator==(s,"q4_0");
        if (bVar1) {
          gVar2 = GGML_TYPE_Q4_0;
        }
        else {
          bVar1 = std::operator==(s,"q4_1");
          if (bVar1) {
            gVar2 = GGML_TYPE_Q4_1;
          }
          else {
            bVar1 = std::operator==(s,"q5_0");
            if (bVar1) {
              gVar2 = GGML_TYPE_Q5_0;
            }
            else {
              bVar1 = std::operator==(s,"q5_1");
              if (bVar1) {
                gVar2 = GGML_TYPE_Q5_1;
              }
              else {
                bVar1 = std::operator==(s,"iq4_nl");
                gVar2 = GGML_TYPE_COUNT;
                if (bVar1) {
                  gVar2 = GGML_TYPE_IQ4_NL;
                }
              }
            }
          }
        }
      }
    }
  }
  return gVar2;
}

Assistant:

static ggml_type ggml_type_from_name(const std::string & s) {
    if (s == "f16") {
        return GGML_TYPE_F16;
    }
    if (s == "bf16") {
        return GGML_TYPE_BF16;
    }
    if (s == "q8_0") {
        return GGML_TYPE_Q8_0;
    }
    if (s == "q4_0") {
        return GGML_TYPE_Q4_0;
    }
    if (s == "q4_1") {
        return GGML_TYPE_Q4_1;
    }
    if (s == "q5_0") {
        return GGML_TYPE_Q5_0;
    }
    if (s == "q5_1") {
        return GGML_TYPE_Q5_1;
    }
    if (s == "iq4_nl") {
        return GGML_TYPE_IQ4_NL;
    }

    return GGML_TYPE_COUNT;
}